

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectoryReader.cpp
# Opt level: O0

string * phpconvert::DirectoryReader::getDirectorySeparator_abi_cxx11_(void)

{
  OS OVar1;
  string *in_RDI;
  OS os;
  string *separator;
  
  OVar1 = getOS();
  std::__cxx11::string::string((string *)in_RDI);
  if (OVar1 == Win) {
    std::__cxx11::string::operator=((string *)in_RDI,(string *)NIX_DS_abi_cxx11_);
  }
  else if (OVar1 == Nix) {
    std::__cxx11::string::operator=((string *)in_RDI,(string *)NIX_DS_abi_cxx11_);
  }
  return in_RDI;
}

Assistant:

string DirectoryReader::getDirectorySeparator() { //cache it
        OS os = getOS();
        string separator; //make it static

        if (os == Win) {
            separator = NIX_DS;
        } else if (os == Nix) {
            separator = NIX_DS;
        }
        return separator;
    }